

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseAssertReturnCommand(WastParser *this,CommandPtr *out_command)

{
  Result RVar1;
  Command *pCVar2;
  _func_int **pp_Var3;
  Enum EVar4;
  Command *pCVar5;
  
  RVar1 = Expect(this,Lpar);
  EVar4 = Error;
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  RVar1 = Expect(this,AssertReturn);
  if (RVar1.enum_ != Error) {
    pCVar2 = (Command *)operator_new(0x20);
    pCVar2->_vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar2->type = 0;
    pCVar2->type = AssertReturn;
    pCVar2->_vptr_Command = (_func_int **)&PTR__AssertReturnCommand_00191fc8;
    pCVar2[1]._vptr_Command = (_func_int **)0x0;
    *(undefined8 *)&pCVar2[1].type = 0;
    RVar1 = ParseAction(this,(ActionPtr *)(pCVar2 + 1));
    if (((RVar1.enum_ == Error) ||
        (RVar1 = ParseExpectedValues(this,(ExpectationPtr *)&pCVar2[1].type), RVar1.enum_ == Error))
       || (RVar1 = Expect(this,Rpar), RVar1.enum_ == Error)) {
      pp_Var3 = pCVar2->_vptr_Command;
      pCVar5 = pCVar2;
    }
    else {
      pCVar5 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar2;
      EVar4 = Ok;
      if (pCVar5 == (Command *)0x0) {
        return (Result)Ok;
      }
      pp_Var3 = pCVar5->_vptr_Command;
    }
    (*pp_Var3[1])(pCVar5);
    return (Result)EVar4;
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseAssertReturnCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseAssertReturnCommand);
  EXPECT(Lpar);
  EXPECT(AssertReturn);
  auto command = std::make_unique<AssertReturnCommand>();
  CHECK_RESULT(ParseAction(&command->action));
  CHECK_RESULT(ParseExpectedValues(&command->expected));
  EXPECT(Rpar);
  *out_command = std::move(command);
  return Result::Ok;
}